

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::Solver(Solver *this)

{
  double *pdVar1;
  bool *pbVar2;
  int32_t *piVar3;
  undefined8 *in_RDI;
  ClauseAllocator *in_stack_fffffffffffffe60;
  VarOrderLt local_30 [2];
  WatcherDeleted local_20 [4];
  
  *in_RDI = &PTR__Solver_01320d10;
  vec<Minisat::lbool,_int>::vec((vec<Minisat::lbool,_int> *)(in_RDI + 1));
  LSet::LSet((LSet *)0xa34083);
  *(undefined4 *)(in_RDI + 8) = 0;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_var_decay);
  in_RDI[9] = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_clause_decay);
  in_RDI[10] = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_random_var_freq);
  in_RDI[0xb] = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_random_seed);
  in_RDI[0xc] = *pdVar1;
  pbVar2 = BoolOption::operator_cast_to_bool_(&opt_luby_restart);
  *(byte *)(in_RDI + 0xd) = *pbVar2 & 1;
  piVar3 = IntOption::operator_cast_to_int_(&opt_ccmin_mode);
  *(int32_t *)((long)in_RDI + 0x6c) = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_phase_saving);
  *(int32_t *)(in_RDI + 0xe) = *piVar3;
  *(undefined1 *)((long)in_RDI + 0x74) = 0;
  pbVar2 = BoolOption::operator_cast_to_bool_(&opt_rnd_init_act);
  *(byte *)((long)in_RDI + 0x75) = *pbVar2 & 1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_garbage_frac);
  in_RDI[0xf] = *pdVar1;
  piVar3 = IntOption::operator_cast_to_int_(&opt_min_learnts_lim);
  *(int32_t *)(in_RDI + 0x10) = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_restart_first);
  *(int32_t *)((long)in_RDI + 0x84) = *piVar3;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_restart_inc);
  in_RDI[0x11] = *pdVar1;
  in_RDI[0x12] = 0x3fd5555555555555;
  in_RDI[0x13] = 0x3ff199999999999a;
  *(undefined4 *)(in_RDI + 0x14) = 100;
  in_RDI[0x15] = 0x3ff8000000000000;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  vec<unsigned_int,_int>::vec((vec<unsigned_int,_int> *)(in_RDI + 0x23));
  vec<unsigned_int,_int>::vec((vec<unsigned_int,_int> *)(in_RDI + 0x25));
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)(in_RDI + 0x27));
  vec<int,_int>::vec((vec<int,_int> *)(in_RDI + 0x29));
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)(in_RDI + 0x2b));
  VMap<double>::VMap((VMap<double> *)in_stack_fffffffffffffe60);
  VMap<Minisat::lbool>::VMap((VMap<Minisat::lbool> *)in_stack_fffffffffffffe60);
  VMap<char>::VMap((VMap<char> *)in_stack_fffffffffffffe60);
  VMap<Minisat::lbool>::VMap((VMap<Minisat::lbool> *)in_stack_fffffffffffffe60);
  VMap<char>::VMap((VMap<char> *)in_stack_fffffffffffffe60);
  VMap<Minisat::Solver::VarData>::VMap((VMap<Minisat::Solver::VarData> *)in_stack_fffffffffffffe60);
  WatcherDeleted::WatcherDeleted(local_20,(ClauseAllocator *)(in_RDI + 0x55));
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::OccLists((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
              *)(in_RDI + 0x3f),local_20);
  VarOrderLt::VarOrderLt
            (local_30,(IntMap<int,_double,_Minisat::MkIndexDefault<int>_> *)(in_RDI + 0x2d));
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::Heap
            ((Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *)
             (in_RDI + 0x48),local_30);
  *(undefined1 *)(in_RDI + 0x4e) = 1;
  in_RDI[0x4f] = 0x3ff0000000000000;
  in_RDI[0x50] = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0x51) = 0;
  *(undefined4 *)((long)in_RDI + 0x28c) = 0xffffffff;
  in_RDI[0x52] = 0;
  in_RDI[0x53] = 0;
  *(undefined1 *)(in_RDI + 0x54) = 1;
  *(undefined4 *)((long)in_RDI + 0x2a4) = 0;
  ClauseAllocator::ClauseAllocator(in_stack_fffffffffffffe60);
  vec<int,_int>::vec((vec<int,_int> *)(in_RDI + 0x59));
  vec<int,_int>::vec((vec<int,_int> *)(in_RDI + 0x5b));
  VMap<char>::VMap((VMap<char> *)in_stack_fffffffffffffe60);
  vec<Minisat::Solver::ShrinkStackElem,_int>::vec
            ((vec<Minisat::Solver::ShrinkStackElem,_int> *)(in_RDI + 0x60));
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)(in_RDI + 0x62));
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)(in_RDI + 100));
  in_RDI[0x69] = 0xffffffffffffffff;
  in_RDI[0x6a] = 0xffffffffffffffff;
  *(undefined1 *)(in_RDI + 0x6b) = 0;
  return;
}

Assistant:

Solver::Solver() :

    // Parameters (user settable):
    //
    verbosity        (0)
  , var_decay        (opt_var_decay)
  , clause_decay     (opt_clause_decay)
  , random_var_freq  (opt_random_var_freq)
  , random_seed      (opt_random_seed)
  , luby_restart     (opt_luby_restart)
  , ccmin_mode       (opt_ccmin_mode)
  , phase_saving     (opt_phase_saving)
  , rnd_pol          (false)
  , rnd_init_act     (opt_rnd_init_act)
  , garbage_frac     (opt_garbage_frac)
  , min_learnts_lim  (opt_min_learnts_lim)
  , restart_first    (opt_restart_first)
  , restart_inc      (opt_restart_inc)

    // Parameters (the rest):
    //
  , learntsize_factor((double)1/(double)3), learntsize_inc(1.1)

    // Parameters (experimental):
    //
  , learntsize_adjust_start_confl (100)
  , learntsize_adjust_inc         (1.5)

    // Statistics: (formerly in 'SolverStats')
    //
  , solves(0), starts(0), decisions(0), rnd_decisions(0), propagations(0), conflicts(0)
  , dec_vars(0), num_clauses(0), num_learnts(0), clauses_literals(0), learnts_literals(0), max_literals(0), tot_literals(0)

  , watches            (WatcherDeleted(ca))
  , order_heap         (VarOrderLt(activity))
  , ok                 (true)
  , cla_inc            (1)
  , var_inc            (1)
  , qhead              (0)
  , simpDB_assigns     (-1)
  , simpDB_props       (0)
  , progress_estimate  (0)
  , remove_satisfied   (true)
  , next_var           (0)

    // Resource constraints:
    //
  , conflict_budget    (-1)
  , propagation_budget (-1)
  , asynch_interrupt   (false)
{}